

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O3

void __thiscall
QMakeSourceFileInfo::setDependencyPaths(QMakeSourceFileInfo *this,QList<QMakeLocalFileName> *l)

{
  qsizetype qVar1;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QMakeLocalFileName> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (QMakeLocalFileName *)0x0;
  local_48.size = 0;
  if ((l->d).size != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      qVar1 = QtPrivate::indexOf<QMakeLocalFileName,QMakeLocalFileName>
                        ((QList<QMakeLocalFileName> *)&local_48,
                         (QMakeLocalFileName *)((long)&(((l->d).ptr)->real_name).d.d + lVar2),0);
      if (qVar1 == -1) {
        QtPrivate::QGenericArrayOps<QMakeLocalFileName>::emplace<QMakeLocalFileName_const&>
                  ((QGenericArrayOps<QMakeLocalFileName> *)&local_48,local_48.size,
                   (QMakeLocalFileName *)((long)&(((l->d).ptr)->real_name).d.d + lVar2));
        QList<QMakeLocalFileName>::end((QList<QMakeLocalFileName> *)&local_48);
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x30;
    } while (uVar3 < (ulong)(l->d).size);
  }
  QArrayDataPointer<QMakeLocalFileName>::operator=(&(this->depdirs).d,&local_48);
  QArrayDataPointer<QMakeLocalFileName>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeSourceFileInfo::setDependencyPaths(const QList<QMakeLocalFileName> &l)
{
    // Ensure that depdirs does not contain the same paths several times, to minimize the stats
    QList<QMakeLocalFileName> ll;
    for (int i = 0; i < l.size(); ++i) {
        if (!ll.contains(l.at(i)))
            ll.append(l.at(i));
    }
    depdirs = ll;
}